

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O2

string * __thiscall
pbrt::TrowbridgeReitzDistribution::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TrowbridgeReitzDistribution *this)

{
  float *in_R8;
  
  StringPrintf<float_const&,float_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ TrowbridgeReitzDistribution alpha_x: %f alpha_y: %f ]",(char *)this,
             &this->alpha_y,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string TrowbridgeReitzDistribution::ToString() const {
    return StringPrintf("[ TrowbridgeReitzDistribution alpha_x: %f alpha_y: %f ]",
                        alpha_x, alpha_y);
}